

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetTypedArrayBuffer
                  (JSContext *ctx,JSValue obj,size_t *pbyte_offset,size_t *pbyte_length,
                  size_t *pbytes_per_element)

{
  JSTypedArray *pJVar1;
  JSValue v;
  JSValue this_val;
  BOOL BVar2;
  JSObject *p_00;
  ulong *in_RCX;
  JSContext *in_RDI;
  ulong *in_R8;
  JSValueUnion in_R9;
  JSTypedArray *ta;
  JSObject *p;
  undefined8 in_stack_ffffffffffffffb0;
  JSContext *in_stack_ffffffffffffffb8;
  JSValueUnion local_10;
  int64_t local_8;
  
  this_val.tag = (int64_t)in_R8;
  this_val.u.ptr = in_R9.ptr;
  p_00 = get_typed_array(in_stack_ffffffffffffffb8,this_val,
                         (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  if (p_00 == (JSObject *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    BVar2 = typed_array_is_detached(in_RDI,p_00);
    if (BVar2 == 0) {
      pJVar1 = (p_00->u).typed_array;
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = (ulong)pJVar1->offset;
      }
      if (in_R8 != (ulong *)0x0) {
        *in_R8 = (ulong)pJVar1->length;
      }
      if (in_R9.ptr != (void *)0x0) {
        *(long *)in_R9.ptr = (long)(1 << (""[(int)((p_00->field_0).header.dummy2 - 0x15)] & 0x1f));
      }
      v.tag = -1;
      v.u = (JSValueUnion)(JSValueUnion)pJVar1->buffer;
      _local_10 = JS_DupValue(in_RDI,v);
    }
    else {
      _local_10 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x151009);
    }
  }
  return _local_10;
}

Assistant:

JSValue JS_GetTypedArrayBuffer(JSContext *ctx, JSValueConst obj,
                               size_t *pbyte_offset,
                               size_t *pbyte_length,
                               size_t *pbytes_per_element)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, obj, FALSE);
    if (!p)
        return JS_EXCEPTION;
    if (typed_array_is_detached(ctx, p))
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    ta = p->u.typed_array;
    if (pbyte_offset)
        *pbyte_offset = ta->offset;
    if (pbyte_length)
        *pbyte_length = ta->length;
    if (pbytes_per_element) {
        *pbytes_per_element = 1 << typed_array_size_log2(p->class_id);
    }
    return JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
}